

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

result_type __thiscall
WellTestCase<Well<unsigned_int,_32UL,_19UL,_1UL,_16UL,_15UL,_14UL,_Detail::M3<19>,_Detail::M3<11>,_Detail::M3<-14>,_Detail::M1,_Detail::M3<18>,_Detail::M1,_Detail::M0,_Detail::M3<-5>,_Detail::NoTempering>,_2068857834U>
::generate(WellTestCase<Well<unsigned_int,_32UL,_19UL,_1UL,_16UL,_15UL,_14UL,_Detail::M3<19>,_Detail::M3<11>,_Detail::M3<_14>,_Detail::M1,_Detail::M3<18>,_Detail::M1,_Detail::M0,_Detail::M3<_5>,_Detail::NoTempering>,_2068857834U>
           *this)

{
  result_type rVar1;
  long lVar2;
  int iVar3;
  uint *p;
  uint state [19];
  uint *local_70;
  uint local_68 [22];
  
  for (lVar2 = 0; lVar2 != 0x4c; lVar2 = lVar2 + 4) {
    *(undefined4 *)((long)local_68 + lVar2) = 1;
  }
  local_70 = local_68;
  Well<unsigned_int,32ul,19ul,1ul,16ul,15ul,14ul,Detail::M3<19>,Detail::M3<11>,Detail::M3<-14>,Detail::M1,Detail::M3<18>,Detail::M1,Detail::M0,Detail::M3<-5>,Detail::NoTempering>
  ::seed<unsigned_int*>
            ((Well<unsigned_int,32ul,19ul,1ul,16ul,15ul,14ul,Detail::M3<19>,Detail::M3<11>,Detail::M3<_14>,Detail::M1,Detail::M3<18>,Detail::M1,Detail::M0,Detail::M3<_5>,Detail::NoTempering>
              *)this,&local_70,local_68 + 0x13);
  rVar1 = 0;
  for (iVar3 = -1000000000; iVar3 != 0; iVar3 = iVar3 + 1) {
    rVar1 = Well<unsigned_int,_32UL,_19UL,_1UL,_16UL,_15UL,_14UL,_Detail::M3<19>,_Detail::M3<11>,_Detail::M3<-14>,_Detail::M1,_Detail::M3<18>,_Detail::M1,_Detail::M0,_Detail::M3<-5>,_Detail::NoTempering>
            ::operator()(&this->rng);
  }
  return rVar1;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, RandomNumberGenerator::state_size, 1);

        unsigned* p = state;
        rng.seed(p, p + RandomNumberGenerator::state_size);

        result_type x = 0;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }